

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

QLayoutItem * __thiscall
QToolBarAreaLayout::unplug(QToolBarAreaLayout *this,QList<int> *path,QToolBarAreaLayout *other)

{
  int iVar1;
  Orientation OVar2;
  uint uVar3;
  int *piVar4;
  QToolBarAreaLayoutItem *pQVar5;
  Representation RVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  QToolBarAreaLayoutItem *this_00;
  pointer pQVar10;
  QSize QVar11;
  pointer pQVar12;
  QSize QVar13;
  QToolBarAreaLayoutItem *pQVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int local_5c;
  
  this_00 = item(this,path);
  piVar4 = (path->d).ptr;
  iVar1 = piVar4[1];
  pQVar10 = QList<QToolBarAreaLayoutLine>::data(&this->docks[*piVar4].lines);
  iVar15 = this_00->size;
  OVar2 = pQVar10[iVar1].o;
  QVar11 = QToolBarAreaLayoutItem::realSizeHint(this_00);
  RVar6 = QVar11.ht.m_i;
  if (OVar2 == Horizontal) {
    RVar6 = QVar11.wd.m_i;
  }
  if (iVar15 != RVar6.m_i) {
    uVar16 = (ulong)(uint)(path->d).ptr[2];
    local_5c = 0;
    do {
      if ((int)uVar16 < 1) break;
      uVar16 = uVar16 - 1;
      pQVar12 = QList<QToolBarAreaLayoutItem>::data(&pQVar10[iVar1].toolBarItems);
      pQVar14 = pQVar12 + uVar16;
      bVar8 = QToolBarAreaLayoutItem::skip(pQVar14);
      if (!bVar8) {
        lVar18 = (long)(path->d).ptr[2];
        lVar7 = lVar18 * 0x18;
        do {
          lVar17 = lVar7;
          lVar18 = lVar18 + 1;
          if (pQVar10[iVar1].toolBarItems.d.size <= lVar18) goto LAB_004706bc;
          pQVar5 = pQVar10[iVar1].toolBarItems.d.ptr;
          bVar9 = QToolBarAreaLayoutItem::skip
                            ((QToolBarAreaLayoutItem *)((long)&pQVar5[1].widgetItem + lVar17));
          lVar7 = lVar17 + 0x18;
        } while (bVar9);
        local_5c = *(int *)((long)&pQVar5[1].pos + lVar17);
        iVar15 = pQVar14->pos;
        OVar2 = pQVar10[iVar1].o;
        QVar11 = QToolBarAreaLayoutItem::sizeHint(pQVar14);
        RVar6 = QVar11.ht.m_i;
        if (OVar2 == Horizontal) {
          RVar6 = QVar11.wd.m_i;
        }
        local_5c = local_5c - (RVar6.m_i + iVar15);
        QToolBarAreaLayoutItem::resize
                  (pQVar14,pQVar10[iVar1].o,*(int *)((long)&pQVar5[1].pos + lVar17) - pQVar14->pos);
      }
LAB_004706bc:
    } while (bVar8);
    if (other != (QToolBarAreaLayout *)0x0) {
      piVar4 = (path->d).ptr;
      iVar1 = piVar4[1];
      pQVar10 = QList<QToolBarAreaLayoutLine>::data(&other->docks[*piVar4].lines);
      uVar3 = (path->d).ptr[2];
      iVar15 = uVar3 + 1;
      lVar7 = (ulong)uVar3 * 0x18;
      do {
        lVar18 = lVar7;
        iVar15 = iVar15 + -1;
        if (iVar15 < 1) goto LAB_0047075d;
        pQVar12 = QList<QToolBarAreaLayoutItem>::data(&pQVar10[iVar1].toolBarItems);
        bVar8 = QToolBarAreaLayoutItem::skip
                          ((QToolBarAreaLayoutItem *)((long)&pQVar12[-1].widgetItem + lVar18));
        lVar7 = lVar18 + -0x18;
      } while (bVar8);
      OVar2 = pQVar10[iVar1].o;
      pQVar14 = (QToolBarAreaLayoutItem *)((long)&pQVar12[-1].widgetItem + lVar18);
      QVar13 = QToolBarAreaLayoutItem::sizeHint(pQVar14);
      QVar11 = (QSize)((ulong)QVar13 >> 0x20);
      if (OVar2 == Horizontal) {
        QVar11 = QVar13;
      }
      QToolBarAreaLayoutItem::resize(pQVar14,OVar2,local_5c + QVar11.wd.m_i.m_i);
    }
  }
LAB_0047075d:
  this_00->gap = true;
  return this_00->widgetItem;
}

Assistant:

QLayoutItem *QToolBarAreaLayout::unplug(const QList<int> &path, QToolBarAreaLayout *other)
{
    //other needs to be update as well
    Q_ASSERT(path.size() == 3);
    QToolBarAreaLayoutItem *item = this->item(path);
    Q_ASSERT(item);

    //update the leading space here
    QToolBarAreaLayoutInfo &info = docks[path.at(0)];
    QToolBarAreaLayoutLine &line = info.lines[path.at(1)];
    if (item->size != pick(line.o, item->realSizeHint())) {
        //the item doesn't have its default size
        //so we'll give this to the next item
        int newExtraSpace = 0;
        //let's iterate over the siblings of the current item that pare placed before it
        //we need to find just the one before
        for (int i = path.at(2) - 1; i >= 0; --i) {
            QToolBarAreaLayoutItem &previous = line.toolBarItems[i];
            if (!previous.skip()) {
                //we need to check if it has a previous element and a next one
                //the previous will get its size changed
                for (int j = path.at(2) + 1; j < line.toolBarItems.size(); ++j) {
                    const QToolBarAreaLayoutItem &next = line.toolBarItems.at(j);
                    if (!next.skip()) {
                        newExtraSpace = next.pos - previous.pos - pick(line.o, previous.sizeHint());
                        previous.resize(line.o, next.pos - previous.pos);
                        break;
                    }
                }
                break;
            }
        }

        if (other) {
            QToolBarAreaLayoutInfo &info = other->docks[path.at(0)];
            QToolBarAreaLayoutLine &line = info.lines[path.at(1)];
            for (int i = path.at(2) - 1; i >= 0; --i) {
                QToolBarAreaLayoutItem &previous = line.toolBarItems[i];
                if (!previous.skip()) {
                    previous.resize(line.o, pick(line.o, previous.sizeHint()) + newExtraSpace);
                    break;
                }
            }

        }
    }

    Q_ASSERT(!item->gap);
    item->gap = true;
    return item->widgetItem;
}